

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O2

size_t wwOctetSize(word *a,size_t n)

{
  long lVar1;
  size_t sVar2;
  ulong uVar3;
  bool bVar4;
  
  lVar1 = ~n << 3;
  do {
    bVar4 = n == 0;
    n = n - 1;
    if (bVar4) {
      return 0;
    }
    lVar1 = lVar1 + 8;
  } while (a[n] == 0);
  sVar2 = -lVar1;
  for (uVar3 = 0xff00000000000000; (uVar3 & a[n]) == 0; uVar3 = uVar3 >> 8) {
    sVar2 = sVar2 - 1;
  }
  return sVar2;
}

Assistant:

size_t wwOctetSize(const word a[], size_t n)
{
	ASSERT(wwIsValid(a, n));
	while (n-- && a[n] == 0);
	if (n == SIZE_MAX)
		return 0;
	{
		size_t pos = O_PER_W - 1;
		word mask = (word)0xFF << 8 * pos;
		while ((a[n] & mask) == 0)
			--pos, mask >>= 8;
		return n * O_PER_W + pos + 1;
	}
}